

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdasher.cpp
# Opt level: O0

void __thiscall VDasher::dashHelper(VDasher *this,VPath *path,VPath *result)

{
  bool bVar1;
  vector<VPointF,_std::allocator<VPointF>_> *this_00;
  vector<VPath::Element,_std::allocator<VPath::Element>_> *this_01;
  VDasher *this_02;
  VPointF in_RDX;
  VPointF *in_RDI;
  VDasher *unaff_retaddr;
  Element *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VPath::Element,_std::allocator<VPath::Element>_> *__range1;
  VPointF *ptPtr;
  vector<VPointF,_std::allocator<VPointF>_> *pts;
  vector<VPath::Element,_std::allocator<VPath::Element>_> *elms;
  vector<VPath::Element,_std::allocator<VPath::Element>_> *in_stack_ffffffffffffff88;
  __normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
  *in_stack_ffffffffffffff90;
  __normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
  local_40;
  vector<VPath::Element,_std::allocator<VPath::Element>_> *local_38;
  VPointF *local_30;
  vector<VPointF,_std::allocator<VPointF>_> *local_28;
  vector<VPath::Element,_std::allocator<VPath::Element>_> *local_20;
  VPointF *p;
  
  in_RDI[5] = in_RDX;
  p = in_RDI;
  this_00 = VPath::points((VPath *)0x111339);
  std::vector<VPointF,_std::allocator<VPointF>_>::size(this_00);
  this_01 = VPath::elements((VPath *)0x111350);
  std::vector<VPath::Element,_std::allocator<VPath::Element>_>::size(this_01);
  VPath::reserve((VPath *)in_stack_ffffffffffffff90,(size_t)in_stack_ffffffffffffff88,0x11136a);
  in_RDI[3].mx = 0.0;
  in_RDI[3].my = 0.0;
  local_20 = VPath::elements((VPath *)0x111381);
  local_28 = VPath::points((VPath *)0x111390);
  local_30 = std::vector<VPointF,_std::allocator<VPointF>_>::data
                       ((vector<VPointF,_std::allocator<VPointF>_> *)0x11139f);
  local_38 = local_20;
  local_40._M_current =
       (Element *)
       std::vector<VPath::Element,_std::allocator<VPath::Element>_>::begin
                 (in_stack_ffffffffffffff88);
  std::vector<VPath::Element,_std::allocator<VPath::Element>_>::end(in_stack_ffffffffffffff88);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffff90,
                            (__normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
                             *)in_stack_ffffffffffffff88), bVar1) {
    this_02 = (VDasher *)
              __gnu_cxx::
              __normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
              ::operator*(&local_40);
    in_stack_ffffffffffffff90 =
         (__normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
          *)(ulong)*(byte *)&this_02->mDashArray;
    switch(in_stack_ffffffffffffff90) {
    case (__normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
          *)0x0:
      local_30 = local_30 + 1;
      moveTo(this_02,in_RDI);
      break;
    case (__normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
          *)0x1:
      local_30 = local_30 + 1;
      lineTo(unaff_retaddr,p);
      break;
    case (__normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
          *)0x2:
      cubicTo((VDasher *)result,(VPointF *)elms,(VPointF *)pts,ptPtr);
      local_30 = local_30 + 3;
      break;
    case (__normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
          *)0x3:
    }
    __gnu_cxx::
    __normal_iterator<const_VPath::Element_*,_std::vector<VPath::Element,_std::allocator<VPath::Element>_>_>
    ::operator++(&local_40);
  }
  in_RDI[5].mx = 0.0;
  in_RDI[5].my = 0.0;
  return;
}

Assistant:

void VDasher::dashHelper(const VPath &path, VPath &result)
{
    mResult = &result;
    mResult->reserve(path.points().size(), path.elements().size());
    mIndex = 0;
    const std::vector<VPath::Element> &elms = path.elements();
    const std::vector<VPointF> &       pts = path.points();
    const VPointF *                    ptPtr = pts.data();

    for (auto &i : elms) {
        switch (i) {
        case VPath::Element::MoveTo: {
            moveTo(*ptPtr++);
            break;
        }
        case VPath::Element::LineTo: {
            lineTo(*ptPtr++);
            break;
        }
        case VPath::Element::CubicTo: {
            cubicTo(*ptPtr, *(ptPtr + 1), *(ptPtr + 2));
            ptPtr += 3;
            break;
        }
        case VPath::Element::Close: {
            // The point is already joined to start point in VPath
            // no need to do anything here.
            break;
        }
        }
    }
    mResult = nullptr;
}